

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

float Gia_ManDelayTraceLut(Gia_Man_t *p)

{
  void *pvVar1;
  Tim_Man_t *pTVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Flt_t *pVVar6;
  float *pfVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *p_00;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pvVar1 = p->pLutLib;
  if ((pvVar1 != (void *)0x0) &&
     (iVar10 = *(int *)((long)pvVar1 + 8), iVar3 = Gia_ManLutSizeMax(p), iVar10 < iVar3)) {
    uVar5 = *(uint *)((long)pvVar1 + 8);
    uVar4 = Gia_ManLutSizeMax(p);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar5,
           (ulong)uVar4);
    return -1e+09;
  }
  if (p->vTiming != (Vec_Flt_t *)0x0) {
    __assert_fail("p->vTiming == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x26c,"void Gia_ManTimeStart(Gia_Man_t *)");
  }
  pVVar6 = (Vec_Flt_t *)calloc(1,0x10);
  p->vTiming = pVVar6;
  if (pVVar6 != (Vec_Flt_t *)0x0) {
    iVar10 = p->nObjs;
    uVar5 = iVar10 * 3;
    uVar11 = 0;
    if (iVar10 < 1) {
      pfVar7 = (float *)0x0;
    }
    else {
      pfVar7 = (float *)malloc((ulong)uVar5 << 2);
      pVVar6->pArray = pfVar7;
      pVVar6->nCap = uVar5;
    }
    uVar9 = 0;
    if (0 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pfVar7[uVar11] = 0.0;
    }
    pVVar6->nSize = uVar5;
    iVar3 = 1;
    for (iVar12 = 0; iVar12 < iVar10; iVar12 = iVar12 + 1) {
      Vec_FltWriteEntry(p->vTiming,iVar3,1e+09);
      iVar10 = p->nObjs;
      iVar3 = iVar3 + 3;
    }
    Gia_ManLevelNum(p);
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    }
    iVar10 = 0;
    while ((iVar10 < p->nObjs && (pGVar8 = Gia_ManObj(p,iVar10), pGVar8 != (Gia_Obj_t *)0x0))) {
      uVar5 = (uint)*(undefined8 *)pGVar8;
      if (((uVar5 & 0x9fffffff) == 0x9fffffff) ||
         (((int)uVar5 < 0 && (~uVar5 & 0x1fffffff) != 0 ||
          (iVar3 = Gia_ObjIsLut(p,iVar10), iVar3 != 0)))) {
        fVar13 = Gia_ObjComputeArrival(p,iVar10,1);
        uVar5 = (uint)*(undefined8 *)pGVar8;
        if (((uVar5 & 0x9fffffff) == 0x9fffffff) &&
           (pTVar2 = (Tim_Man_t *)p->pManTime, pTVar2 != (Tim_Man_t *)0x0)) {
          iVar3 = Gia_ObjCioId(pGVar8);
          fVar13 = Tim_ManGetCiArrival(pTVar2,iVar3);
          uVar5 = (uint)*(undefined8 *)pGVar8;
        }
        if (((~uVar5 & 0x1fffffff) != 0 && (int)uVar5 < 0) &&
           (pTVar2 = (Tim_Man_t *)p->pManTime, pTVar2 != (Tim_Man_t *)0x0)) {
          iVar3 = Gia_ObjCioId(pGVar8);
          Tim_ManSetCoArrival(pTVar2,iVar3,fVar13);
        }
        Gia_ObjSetTimeArrival(p,iVar10,fVar13);
      }
      iVar10 = iVar10 + 1;
    }
    iVar10 = 0;
    fVar13 = -1e+09;
    while ((iVar10 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar10), pGVar8 != (Gia_Obj_t *)0x0)))
    {
      iVar3 = Gia_ObjId(p,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff));
      fVar14 = Gia_ObjTimeArrival(p,iVar3);
      iVar3 = Gia_ObjId(p,pGVar8);
      Gia_ObjSetTimeArrival(p,iVar3,fVar14);
      if (fVar14 <= fVar13) {
        fVar14 = fVar13;
      }
      fVar13 = fVar14;
      iVar10 = iVar10 + 1;
    }
    if ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) {
      iVar10 = 0;
      while ((iVar10 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar10), pGVar8 != (Gia_Obj_t *)0x0))
            ) {
        iVar3 = Gia_ObjId(p,pGVar8);
        Gia_ObjSetTimeRequired(p,iVar3,fVar13);
        iVar10 = iVar10 + 1;
      }
    }
    else {
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
      Tim_ManInitPoRequiredAll((Tim_Man_t *)p->pManTime,fVar13);
    }
    p_00 = Gia_ManOrderReverse(p);
    iVar10 = 0;
    while( true ) {
      if (p_00->nSize <= iVar10) {
        Vec_IntFree(p_00);
        return fVar13;
      }
      iVar3 = Vec_IntEntry(p_00,iVar10);
      pGVar8 = Gia_ManObj(p,iVar3);
      iVar12 = Gia_ObjIsLut(p,iVar3);
      if (iVar12 == 0) {
        uVar5 = (uint)*(undefined8 *)pGVar8;
        if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
          pTVar2 = (Tim_Man_t *)p->pManTime;
          if (pTVar2 != (Tim_Man_t *)0x0) {
            iVar12 = Gia_ObjCioId(pGVar8);
            fVar14 = Gia_ObjTimeRequired(p,iVar3);
            Tim_ManSetCiRequired(pTVar2,iVar12,fVar14);
          }
        }
        else if ((~uVar5 & 0x1fffffff) != 0 && (int)uVar5 < 0) {
          pTVar2 = (Tim_Man_t *)p->pManTime;
          if (pTVar2 != (Tim_Man_t *)0x0) {
            iVar12 = Gia_ObjCioId(pGVar8);
            fVar14 = Tim_ManGetCoRequired(pTVar2,iVar12);
            Gia_ObjSetTimeRequired(p,iVar3,fVar14);
          }
          iVar12 = Gia_ObjFaninId0p(p,pGVar8);
          fVar14 = Gia_ObjTimeRequired(p,iVar12);
          fVar15 = Gia_ObjTimeRequired(p,iVar3);
          if (fVar15 < fVar14) {
            iVar12 = Gia_ObjFaninId0p(p,pGVar8);
            fVar14 = Gia_ObjTimeRequired(p,iVar3);
            Gia_ObjSetTimeRequired(p,iVar12,fVar14);
          }
        }
      }
      else {
        Gia_ObjPropagateRequired(p,iVar3,1);
      }
      fVar14 = Gia_ObjTimeRequired(p,iVar3);
      fVar15 = Gia_ObjTimeArrival(p,iVar3);
      fVar14 = fVar14 - fVar15;
      if (fVar14 + 0.01 <= 0.0) break;
      fVar15 = 0.0;
      if (0.0 <= fVar14) {
        fVar15 = fVar14;
      }
      Vec_FltWriteEntry(p->vTiming,iVar3 * 3 + 2,fVar15);
      iVar10 = iVar10 + 1;
    }
    __assert_fail("tSlack + 0.01 > 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                  ,0x13e,"float Gia_ManDelayTraceLut(Gia_Man_t *)");
  }
  __assert_fail("p->vTiming != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x26b,"void Gia_ManTimeClean(Gia_Man_t *)");
}

Assistant:

float Gia_ManDelayTraceLut( Gia_Man_t * p )
{
    int fUseSorting = 1;
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    float tArrival, tArrivalCur, tRequired, tSlack;
    int i, iObj;

    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -TIM_ETERNITY;
    }

    // initialize the arrival times
    Gia_ManTimeStart( p );
    Gia_ManLevelNum( p );

    // propagate arrival times
    if ( p->pManTime )
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !Gia_ObjIsCi(pObj) && !Gia_ObjIsCo(pObj) && !Gia_ObjIsLut(p, i) )
            continue;
        tArrival = Gia_ObjComputeArrival( p, i, fUseSorting );
        if ( Gia_ObjIsCi(pObj) && p->pManTime )
        {
            tArrival = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
//printf( "%.3f  ", tArrival );
        }
        if ( Gia_ObjIsCo(pObj) && p->pManTime )
            Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), tArrival );
        Gia_ObjSetTimeArrival( p, i, tArrival );
    }

    // get the latest arrival times
    tArrival = -TIM_ETERNITY;
    Gia_ManForEachCo( p, pObj, i )
    {
        tArrivalCur = Gia_ObjTimeArrivalObj( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetTimeArrival( p, Gia_ObjId(p,pObj), tArrivalCur );
        if ( tArrival < tArrivalCur )
            tArrival = tArrivalCur;
    }

    // initialize the required times
    if ( p->pManTime )
    {
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Tim_ManInitPoRequiredAll( (Tim_Man_t *)p->pManTime, tArrival );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetTimeRequiredObj( p, pObj, tArrival );
    }

    // propagate the required times
    vObjs = Gia_ManOrderReverse( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        pObj = Gia_ManObj(p, iObj);
        if ( Gia_ObjIsLut(p, iObj) )
        {
            Gia_ObjPropagateRequired( p, iObj, fUseSorting );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
                Tim_ManSetCiRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), Gia_ObjTimeRequired(p, iObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( p->pManTime )
            {
                tRequired = Tim_ManGetCoRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
                Gia_ObjSetTimeRequired( p, iObj, tRequired );
            }
            if ( Gia_ObjTimeRequired(p, Gia_ObjFaninId0p(p, pObj)) > Gia_ObjTimeRequired(p, iObj) )
                Gia_ObjSetTimeRequired(p, Gia_ObjFaninId0p(p, pObj), Gia_ObjTimeRequired(p, iObj) );
        }

        // set slack for this object
        tSlack = Gia_ObjTimeRequired(p, iObj) - Gia_ObjTimeArrival(p, iObj);
        assert( tSlack + 0.01 > 0.0 );
        Gia_ObjSetTimeSlack( p, iObj, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_IntFree( vObjs );
    return tArrival;
}